

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

void compute_ui_entry_values_for_player
               (ui_entry *entry,player *p,cached_player_data **cache,int *val,int *auxval)

{
  char cVar1;
  ushort uVar2;
  short sVar3;
  char *__s1;
  loc grid;
  bound_object_property *pbVar4;
  short *psVar5;
  bool bVar6;
  ui_entry_combiner_funcs *puVar7;
  _Bool _Var8;
  _Bool _Var9;
  int iVar10;
  wchar_t wVar11;
  int iVar12;
  cached_player_data *f;
  object *poVar13;
  bound_player_ability *pbVar14;
  int *piVar15;
  bitflag *pbVar16;
  long lVar18;
  int iVar19;
  wchar_t wVar20;
  _Bool _Var21;
  uint uVar22;
  wchar_t wVar23;
  long lVar24;
  int iVar25;
  bool bVar26;
  ui_entry_combiner_state_conflict cst;
  ui_entry_combiner_funcs_conflict combiner;
  ui_entry_combiner_state local_98;
  bitflag *local_88;
  ui_entry_combiner_funcs local_80;
  bitflag *local_60;
  int *local_58;
  int *local_50;
  cached_player_data **local_48;
  ulong local_40;
  int *local_38;
  bitflag *pbVar17;
  
  local_98.work = (void *)0x0;
  local_98.accum = 0;
  local_98.accum_aux = 0;
  if (p == (player *)0x0) {
    *val = 0x7ffffffe;
    local_98.accum_aux = 0x7ffffffe;
  }
  else {
    local_58 = val;
    local_50 = auxval;
    if (*cache == (cached_player_data *)0x0) {
      f = (cached_player_data *)mem_alloc(0xc);
      *cache = f;
      player_flags(p,(bitflag *)f);
      flag_wipe((*cache)->timed,6);
      player_flags_timed(p,(*cache)->timed);
      if (p->timed[0x20] != 0) {
        flag_on_dbg((*cache)->timed,6,0x28,"(*cache)->timed","OF_TRAP_IMMUNE");
      }
    }
    local_48 = cache;
    iVar10 = ui_entry_combiner_get_funcs(entry->combiner_index,&local_80);
    if (iVar10 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                    ,0x375,
                    "void compute_ui_entry_values_for_player(const struct ui_entry *, struct player *, struct cached_player_data **, int *, int *)"
                   );
    }
    if (entry->n_p_ability < L'\x01') {
      bVar6 = true;
    }
    else {
      local_60 = (p->state).pflags;
      bVar6 = true;
      local_38 = &timed_effects[0].temp_resist;
      pbVar16 = (bitflag *)0x0;
      local_40 = 0;
      do {
        pbVar14 = entry->p_abilities;
        uVar2 = (pbVar14[(long)pbVar16].ability)->index;
        wVar11 = entry->flags;
        if (((wVar11 & 1U) == 0) || (pbVar17 = pbVar16, pbVar14[(long)pbVar16].isaux == false)) {
          __s1 = (pbVar14[(long)pbVar16].ability)->type;
          local_88 = pbVar16;
          iVar10 = strcmp(__s1,"player");
          uVar22 = (uint)uVar2;
          if (iVar10 == 0) {
            _Var9 = flag_has_dbg(local_60,10,(uint)uVar2,"p->state.pflags","(ind)");
            pbVar17 = local_88;
            if (_Var9) {
              pbVar14 = entry->p_abilities;
              if (pbVar14[(long)pbVar16].have_value == true) {
                bVar26 = pbVar14[(long)pbVar16].isaux != false;
                wVar20 = L'\x7ffffffe';
                if (bVar26) {
                  wVar20 = pbVar14[(long)pbVar16].value;
                }
                wVar23 = pbVar14[(long)pbVar16].value;
                if (bVar26) {
                  wVar23 = L'\x7ffffffe';
                }
              }
              else {
                if (uVar2 < 0x2e) {
                  if (uVar2 < 0x19) {
                    if (uVar2 == 0x12) {
                      _Var9 = player_of_has(p,L'\x1e');
                      if (_Var9) {
                        _Var9 = entry->p_abilities[(long)pbVar16].isaux;
                        wVar20 = (uint)(_Var9 ^ 1U) + (uint)(_Var9 ^ 1U) * 2 + L'\xfffffffd';
                        wVar23 = (uint)_Var9 + (uint)_Var9 * 2 + L'\xfffffffd';
                        goto joined_r0x001e250e;
                      }
                    }
                    else if (uVar2 == 0x13) {
                      wVar11 = slot_by_name(p,"weapon");
                      poVar13 = slot_object(p,wVar11);
                      wVar11 = L'\0';
                      if (poVar13 == (object *)0x0) {
                        wVar11 = (int)(short)(p->lev - (p->lev >> 0xf)) >> 1;
                      }
                      pbVar14 = entry->p_abilities;
                      goto LAB_001e25de;
                    }
                  }
                  else {
                    if (uVar2 == 0x19) {
                      wVar11 = (wchar_t)(0x1d < p->lev);
                      cVar1 = pbVar14[(long)pbVar16].isaux;
                      goto LAB_001e25f6;
                    }
                    if (uVar2 == 0x25) {
                      poVar13 = equipped_item_by_slot_name(p,"shooting");
                      wVar23 = L'\0';
                      if ((poVar13 != (object *)0x0) &&
                         (_Var9 = flag_has_dbg(poVar13->kind->kind_flags,4,0x19,
                                               "launcher->kind->kind_flags","KF_SHOOTS_ARROWS"),
                         wVar23 = L'\0', _Var9)) {
                        wVar23 = (wchar_t)(p->lev / 3);
                      }
                      bVar26 = entry->p_abilities[(long)pbVar16].isaux != false;
                      wVar20 = L'\0';
                      if (bVar26) {
                        wVar20 = wVar23;
                      }
                      if (bVar26) {
                        wVar23 = L'\0';
                      }
                      goto joined_r0x001e250e;
                    }
                  }
                  goto LAB_001e2464;
                }
                if (uVar2 < 0x37) {
                  if (uVar22 == 0x2e) {
                    wVar11 = L'\0';
                    if (0x23 < p->lev) {
                      _Var9 = flag_has_dbg(local_60,10,0x2d,"p->state.pflags","(PF_STRONG_MAGIC)");
                      wVar11 = L'\x01';
                      if (!_Var9) {
                        wVar11 = (wchar_t)(0x2d < p->lev);
                      }
                    }
                  }
                  else {
                    if (uVar22 != 0x30) goto LAB_001e2464;
                    if ((character_dungeon == true) &&
                       (_Var9 = flag_has_dbg(local_60,10,0x16,"p->state.pflags","(PF_ELVEN)"), _Var9
                       )) {
                      grid.x = (p->grid).x;
                      grid.y = (p->grid).y;
                      _Var9 = square_istree(cave,grid);
                      wVar11 = L'\x03';
                      if (_Var9) goto LAB_001e25da;
                    }
                    wVar11 = L'\0';
                  }
LAB_001e25da:
                  pbVar14 = entry->p_abilities;
LAB_001e25de:
                  cVar1 = pbVar14[(long)pbVar16].isaux;
LAB_001e25f6:
                  wVar23 = wVar11;
                  wVar20 = L'\0';
                  if (cVar1 != '\0') {
                    wVar23 = L'\0';
                    wVar20 = wVar11;
                  }
                }
                else {
                  if ((uVar2 != 0x37) && (uVar22 != 0x4a)) goto LAB_001e2464;
                  if (p->speed_boost == 0) {
                    wVar23 = L'\0';
                  }
                  else {
                    wVar23 = (p->speed_boost + 5) / 10;
                  }
                  bVar26 = pbVar14[(long)pbVar16].isaux != false;
                  wVar20 = L'\0';
                  if (bVar26) {
                    wVar20 = wVar23;
                  }
                  if (bVar26) {
                    wVar23 = L'\0';
                  }
                }
              }
joined_r0x001e250e:
              if (bVar6) {
                (*local_80.init_func)(wVar23,wVar20,&local_98);
                bVar6 = false;
              }
              else {
                (*local_80.accum_func)(wVar23,wVar20,&local_98);
              }
            }
          }
          else {
            iVar10 = strcmp(__s1,"object");
            if (iVar10 == 0) {
              uVar22 = (uint)uVar2;
              _Var8 = flag_has_dbg((*local_48)->untimed,6,(uint)uVar2,"(*cache)->untimed","ind");
              _Var9 = false;
              if ((entry->flags & L'\x01') != L'\0') {
                _Var9 = flag_has_dbg((*local_48)->timed,6,uVar22,"(*cache)->timed","ind");
              }
              _Var21 = _Var8;
              if (entry->p_abilities[(long)pbVar16].isaux != false) {
                _Var21 = _Var9;
                _Var9 = _Var8;
              }
              puVar7 = (ui_entry_combiner_funcs *)&local_80.accum_func;
              if (bVar6) {
                bVar6 = false;
                puVar7 = &local_80;
              }
              (*puVar7->init_func)(SUB14(_Var21,0),SUB14(_Var9,0),&local_98);
              _Var9 = flag_has_dbg(p->shape->flags,6,uVar22,"p->shape->flags","ind");
              pbVar17 = local_88;
              if ((_Var9) &&
                 (_Var8 = flag_has_dbg(p->obj_k->flags,6,uVar22,"p->obj_k->flags","ind"),
                 pbVar17 = local_88, _Var8)) {
                bVar26 = entry->p_abilities[(long)pbVar16].isaux != false;
                _Var8 = false;
                if (bVar26) {
                  _Var8 = _Var9;
                }
                if (bVar26) {
                  _Var9 = false;
                }
                (*local_80.accum_func)(SUB14(_Var9,0),SUB14(_Var8,0),&local_98);
                pbVar17 = local_88;
              }
            }
            else {
              iVar10 = strcmp(__s1,"element");
              pbVar17 = local_88;
              if (iVar10 == 0 && (local_40 & 1) == 0) {
                iVar10 = 100;
                if ((wVar11 & 1U) != 0) {
                  lVar18 = 0;
                  piVar15 = local_38;
                  do {
                    if ((p->timed[lVar18] != 0) && (*piVar15 == uVar22)) {
                      iVar10 = 0x3c;
                      break;
                    }
                    lVar18 = lVar18 + 1;
                    piVar15 = piVar15 + 0x1e;
                  } while (lVar18 != 0x35);
                }
                iVar25 = (int)p->race->el_info[uVar2].res_level;
                iVar12 = iVar10;
                if (pbVar14[(long)pbVar16].isaux != false) {
                  iVar12 = iVar25;
                  iVar25 = iVar10;
                }
                puVar7 = (ui_entry_combiner_funcs *)&local_80.accum_func;
                if (bVar6) {
                  bVar6 = false;
                  puVar7 = &local_80;
                }
                (*puVar7->init_func)(iVar25,iVar12,&local_98);
                iVar10 = (int)p->shape->el_info[uVar2].res_level;
                local_40 = CONCAT71((int7)((ulong)p->shape >> 8),1);
                pbVar17 = local_88;
                if ((iVar10 != 100) && (p->obj_k->el_info[uVar2].res_level != 0)) {
                  iVar25 = 100;
                  iVar12 = iVar10;
                  if (entry->p_abilities[(long)pbVar16].isaux == false) {
                    iVar12 = iVar25;
                    iVar25 = iVar10;
                  }
                  (*local_80.accum_func)(iVar25,iVar12,&local_98);
                  pbVar17 = local_88;
                }
              }
            }
          }
        }
LAB_001e2464:
        pbVar16 = pbVar17 + 1;
      } while ((long)pbVar16 < (long)entry->n_p_ability);
    }
    if (L'\0' < entry->n_obj_prop) {
      local_88 = (p->state).pflags;
      lVar18 = 0;
      lVar24 = 0;
      do {
        pbVar4 = entry->obj_props;
        iVar10 = *(int *)((long)&pbVar4->index + lVar18);
        if ((((&pbVar4->isaux)[lVar18] != true) || ((entry->flags & L'\x01') == L'\0')) &&
           (*(int *)((long)&pbVar4->type + lVar18) - 1U < 2)) {
          iVar25 = (int)p->shape->modifiers[iVar10];
          iVar12 = 0;
          if ((entry->flags & L'\x01') != L'\0') {
            _Var9 = flag_has_dbg(local_88,10,0x42,"p->state.pflags","(PF_ENHANCE_MAGIC)");
            iVar19 = 0;
            switch(iVar10) {
            case 5:
              sVar3 = p->timed[0x33];
              iVar19 = (uint)_Var9 * 3 + 10;
              break;
            default:
              goto switchD_001e270e_caseD_6;
            case 7:
              sVar3 = p->timed[0x12];
              iVar19 = (uint)_Var9 * 3 + 5;
              break;
            case 9:
              psVar5 = p->timed;
              if ((*psVar5 == 0) && (psVar5[0x1d] == 0)) {
                iVar12 = 0;
              }
              else {
                iVar12 = (uint)_Var9 * 3 + 10;
              }
              iVar19 = iVar12 + -5;
              if (psVar5[0x1b] == 0) {
                iVar19 = iVar12;
              }
              iVar12 = iVar19 + -10;
              if (psVar5[1] == 0) {
                iVar12 = iVar19;
              }
              iVar19 = iVar12 + 10;
              sVar3 = psVar5[0x1c];
              goto LAB_001e2778;
            case 10:
              if (p->timed[0x31] != 0) {
                iVar12 = (int)p->timed[0x31] / 0x14;
              }
              goto LAB_001e2780;
            }
            iVar12 = 0;
LAB_001e2778:
            if (sVar3 == 0) {
              iVar19 = iVar12;
            }
switchD_001e270e_caseD_6:
            iVar12 = iVar19;
          }
LAB_001e2780:
          iVar19 = iVar12;
          if ((&entry->obj_props->isaux)[lVar18] != false) {
            iVar19 = iVar25;
            iVar25 = iVar12;
          }
          puVar7 = (ui_entry_combiner_funcs *)&local_80.accum_func;
          if (bVar6) {
            bVar6 = false;
            puVar7 = &local_80;
          }
          (*puVar7->init_func)(iVar25,iVar19,&local_98);
          if (iVar10 == 7) {
            wVar11 = p->race->infra;
          }
          else {
            if (iVar10 != 8) goto LAB_001e281d;
            wVar11 = p->race->r_skills[9] / 0x14;
          }
          wVar23 = L'\0';
          if ((&entry->obj_props->isaux)[lVar18] != false) {
            wVar23 = wVar11;
            wVar11 = L'\0';
          }
          (*local_80.accum_func)(wVar11,wVar23,&local_98);
        }
LAB_001e281d:
        lVar24 = lVar24 + 1;
        lVar18 = lVar18 + 0x10;
      } while (lVar24 < entry->n_obj_prop);
    }
    if (bVar6) {
      *local_58 = 0x7ffffffe;
      local_98.accum_aux = 0x7ffffffe;
      auxval = local_50;
    }
    else {
      (*local_80.finish_func)(&local_98);
      *local_58 = local_98.accum;
      auxval = local_50;
    }
  }
  *auxval = local_98.accum_aux;
  return;
}

Assistant:

void compute_ui_entry_values_for_player(const struct ui_entry *entry,
	struct player *p, struct cached_player_data **cache, int *val,
	int *auxval)
{
	struct ui_entry_combiner_state cst = { 0, 0, 0 };
	struct ui_entry_combiner_funcs combiner;
	bool first, element_done = false;
	int i;

	if (!p) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
		return;
	}
	if (*cache == NULL) {
		*cache = mem_alloc(sizeof(**cache));
		player_flags(p, (*cache)->untimed);
		of_wipe((*cache)->timed);
		player_flags_timed(p, (*cache)->timed);
		if (p->timed[TMD_TRAPSAFE]) {
			of_on((*cache)->timed, OF_TRAP_IMMUNE);
		}
	}
	first = true;
	if (ui_entry_combiner_get_funcs(entry->combiner_index, &combiner)) {
		assert(0);
	}
	for (i = 0; i < entry->n_p_ability; ++i) {
		int ind = entry->p_abilities[i].ability->index;

		if ((entry->flags & ENTRY_FLAG_TIMED_AUX) &&
			entry->p_abilities[i].isaux) {
			continue;
		}
		if (streq(entry->p_abilities[i].ability->type, "player")) {
			if (! player_has(p, ind)) {
				continue;
			}
			if (entry->p_abilities[i].have_value) {
				int v = entry->p_abilities[i].value;
				int a = UI_ENTRY_VALUE_NOT_PRESENT;

				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				if (first) {
					(*combiner.init_func)(v, a, &cst);
					first = false;
				} else {
					(*combiner.accum_func)(v, a, &cst);
				}
			} else {
				int v, a;
				struct object *launcher;

				/*
				 * Handle player abilities that did not bind a
				 * value to the user interface element as
				 * special cases.
				 */
				switch (ind) {
				case PF_BOW_SPEED_GREAT:
					launcher = equipped_item_by_slot_name(
						p, "shooting");
					if (launcher && kf_has(launcher->kind->kind_flags,
						KF_SHOOTS_ARROWS)) {
						v = p->lev / 3;
						a = 0;
					} else {
						v = 0;
						a = 0;
					}
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_BRAVERY_30:
					/*
					 * player_flags() accounts for
					 * PF_BRAVERY_30 so this is only
					 * necessary in cases where
					 * OF_PROT_FEAR isn't also bound to
					 * the element.
					 */
					v = (p->lev >= 30) ? 1 : 0;
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_FURY:
				case PF_PHASEWALK:
					v = (p->speed_boost) ?
						 ((p->speed_boost + 5) / 10) : 0;
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_HOLY:
					if ((p->lev > 35 &&
						player_has(p, PF_STRONG_MAGIC)) ||
						p->lev > 45) {
						v = 1;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_SHADOW:
					if (player_of_has(p, OF_AGGRAVATE)) {
						v = -3;
						a = 0;
						if (entry->p_abilities[i].isaux) {
							int t = v;

							v = a;
							a = t;
						}
						if (first) {
							(*combiner.init_func)(v, a, &cst);
							first = false;
						} else {
							(*combiner.accum_func)(v, a, &cst);
						}
					};
					break;

				case PF_WOODEN:
					/* Account for unarmed digging bonus. */
					if (! slot_object(p, slot_by_name(p, "weapon"))) {
						v = p->lev / 2;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_WOODSMAN:
					if (character_dungeon &&
						player_has(p, PF_ELVEN) &&
						square_istree(cave, p->grid)) {
						v = 3;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;
				}
			}
		} else if (streq(entry->p_abilities[i].ability->type,
			"object")) {
			int v = of_has((*cache)->untimed, ind) ? 1 : 0;
			int a;

			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = of_has((*cache)->timed, ind) ? 1 : 0;
			} else {
				a = 0;
			}
			if (entry->p_abilities[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}

			v = of_has(p->shape->flags, ind) ? 1 : 0;
			a = 0;
			if (v && of_has(p->obj_k->flags, ind)) {
				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
		} else if (streq(entry->p_abilities[i].ability->type,
			"element") && !element_done) {
			int v = p->race->el_info[ind].res_level;
			int a;
			int base = RES_LEVEL_BASE;

			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = get_timed_element_effect(p, ind);
			} else {
				a = base;
			}
			if (entry->p_abilities[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}
			v = p->shape->el_info[ind].res_level;
			a = base;
			if (v != base && p->obj_k->el_info[ind].res_level) {
				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			element_done = true;
		}
	}
	/*
	 * Since stats and modifiers aren't stored in the ability list, check
	 * if any object properties for those are bound to this element.
	 * Then lookup the player's intrinsic values for those.
	 */
	for (i = 0; i < entry->n_obj_prop; ++i) {
		int ind = entry->obj_props[i].index;
		int skill_ind, skill_cnv_num, skill_cnv_den;
		int v, a;

		if (entry->obj_props[i].isaux &&
			(entry->flags & ENTRY_FLAG_TIMED_AUX)) {
			continue;
		}
		switch (entry->obj_props[i].type) {
		case OBJ_PROPERTY_STAT:
		case OBJ_PROPERTY_MOD:
			v = p->shape->modifiers[ind];
			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = get_timed_modifier_effect(p, ind);
			} else {
				a = 0;
			}
			if (entry->obj_props[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}
			/*
			 * Racial information doesn't store modifiers but does
			 * store skills.  If applicable, extract the relevant
			 * value and convert.
			 */
			modifier_to_skill(ind, &skill_ind, &skill_cnv_num,
				&skill_cnv_den);
			if (skill_ind >= 0) {
				v = (p->race->r_skills[skill_ind] *
					skill_cnv_num) / skill_cnv_den;
				a = 0;
				if (entry->obj_props[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			/*
			 * Uggh, the player race handles infravision
			 * separately.
			 */
			if (ind == OBJ_MOD_INFRA) {
				v = p->race->infra;
				a = 0;
				if (entry->obj_props[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			break;
		}
	}
	if (first) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
	} else {
		(*combiner.finish_func)(&cst);
		*val = cst.accum;
		*auxval = cst.accum_aux;
	}
}